

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O3

GrowingAlignedDataBuffer * __thiscall
siamese::DecoderPacketWindow::GetSum
          (DecoderPacketWindow *this,uint laneIndex,uint sumIndex,uint elementEnd)

{
  OriginalPacket *pOVar1;
  ostringstream *this_00;
  uint bytes;
  DecoderSubwindow *pDVar2;
  bool bVar3;
  GrowingAlignedDataBuffer *this_01;
  OutputWorker *this_02;
  uint8_t y;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  undefined1 local_1b8 [392];
  
  uVar6 = this->Lanes[laneIndex].Sums[sumIndex].ElementEnd;
  if (uVar6 < elementEnd) {
    this_01 = &this->Lanes[laneIndex].Sums[sumIndex].Buffer;
    this_00 = (ostringstream *)(local_1b8 + 0x10);
    do {
      pDVar2 = (this->Subwindows).DataPtr[uVar6 >> 6];
      bytes = (pDVar2->Originals)._M_elems[uVar6 & 0x3f].Buffer.Bytes;
      if (DAT_001b9020 < 3) {
        local_1b8._0_8_ = Logger;
        local_1b8._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,DAT_001b9050,DAT_001b9058);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Lane ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," sum ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," accumulating column: ",0x16);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Got = ",8);
        pcVar5 = "true";
        if (bytes == 0) {
          pcVar5 = "false";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,pcVar5,(ulong)(bytes == 0) | 4);
        this_02 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      if (bytes != 0) {
        if (this->Lanes[laneIndex].Sums[sumIndex].Buffer.Bytes < bytes) {
          bVar3 = GrowingAlignedDataBuffer::GrowZeroPadded(this_01,this->TheAllocator,bytes);
          if (!bVar3) {
            this->EmergencyDisabled = true;
            goto LAB_0014800d;
          }
        }
        pOVar1 = (pDVar2->Originals)._M_elems + (uVar6 & 0x3f);
        if (sumIndex == 0) {
          gf256_add_mem(this_01->Data,(pOVar1->Buffer).Data,bytes);
        }
        else {
          uVar4 = (pOVar1->Column * 199) % 0xfd;
          y = (char)uVar4 + '\x03';
          if (sumIndex == 2) {
            y = GF256Ctx.GF256_SQR_TABLE[(ulong)uVar4 + 3];
          }
          gf256_muladd_mem(this_01->Data,y,(pOVar1->Buffer).Data,bytes);
        }
      }
      uVar6 = uVar6 + 8;
    } while (uVar6 < elementEnd);
    this->Lanes[laneIndex].Sums[sumIndex].ElementEnd = uVar6;
  }
LAB_0014800d:
  return &this->Lanes[laneIndex].Sums[sumIndex].Buffer;
}

Assistant:

const GrowingAlignedDataBuffer* DecoderPacketWindow::GetSum(unsigned laneIndex, unsigned sumIndex, unsigned elementEnd)
{
    DecoderSum& sum = Lanes[laneIndex].Sums[sumIndex];

    SIAMESE_DEBUG_ASSERT(sum.ElementStart <= sum.ElementEnd);
    SIAMESE_DEBUG_ASSERT((sum.ElementStart + ColumnStart) % kColumnLaneCount == laneIndex);
    SIAMESE_DEBUG_ASSERT((sum.ElementEnd + ColumnStart) % kColumnLaneCount == laneIndex);

    unsigned element = sum.ElementEnd;
    if (element >= elementEnd) {
        return &sum.Buffer;
    }

    // For each element to accumulate in this lane:
    do
    {
        SIAMESE_DEBUG_ASSERT((element + ColumnStart) % kColumnLaneCount == laneIndex);
        OriginalPacket* original     = GetWindowElement(element);
        const unsigned originalBytes = original->Buffer.Bytes;

        Logger.Info("Lane ", laneIndex,  " sum ",  sumIndex,  " accumulating column: ",  element + ColumnStart,  ". Got = ",  (originalBytes > 0));

        if (originalBytes > 0)
        {
            SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == laneIndex);
            if (originalBytes > sum.Buffer.Bytes)
            {
                // Grow sum to encompass the original data
                if (!sum.Buffer.GrowZeroPadded(TheAllocator, originalBytes))
                {
                    EmergencyDisabled = true;
                    goto ExitSum;
                }
            }

            // Sum += PacketData
            if (sumIndex == 0)
                gf256_add_mem(sum.Buffer.Data, original->Buffer.Data, originalBytes);
            else
            {
                uint8_t CX = GetColumnValue(original->Column);
                if (sumIndex == 2)
                    CX = gf256_sqr(CX);

                // Sum += CX * PacketData
                gf256_muladd_mem(sum.Buffer.Data, CX, original->Buffer.Data, originalBytes);
            }
        }

        SIAMESE_DEBUG_ASSERT(original->Buffer.Bytes == 0 || original->Column % kColumnLaneCount == laneIndex);
        element += kColumnLaneCount;
    } while (element < elementEnd);

    SIAMESE_DEBUG_ASSERT((element + ColumnStart) % kColumnLaneCount == laneIndex);

    sum.ElementEnd = element;

ExitSum:
    return &sum.Buffer;
}